

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::RenderImagesList(CEditor *this,CUIRect ToolBox)

{
  CUI *this_00;
  CEditorImage **pID;
  long lVar1;
  CLayerGroup *pCVar2;
  CLayer *pCVar3;
  bool bVar4;
  int iVar5;
  char *pText;
  int iVar6;
  int g;
  long lVar7;
  int l;
  long lVar8;
  long lVar9;
  int i;
  ulong uVar10;
  int e;
  uint uVar11;
  long in_FS_OFFSET;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_68;
  undefined8 local_64;
  float local_5c;
  CUIRect Slot;
  CUIRect ToolBox_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar14 = (float)(this->m_Map).m_lImages.num_elements * 14.0 + 40.0 + 17.0;
  fVar15 = fVar14 - ToolBox.h;
  ToolBox_local = ToolBox;
  if (fVar15 <= 0.0) {
    fVar15 = 0.0;
    RenderImagesList::s_ScrollValue = 0.0;
  }
  else {
    CUIRect::VSplitRight(&ToolBox_local,15.0,&ToolBox_local,&Slot);
    CUIRect::VSplitRight(&ToolBox_local,3.0,&ToolBox_local,(CUIRect *)0x0);
    this_00 = &this->m_UI;
    RenderImagesList::s_ScrollValue =
         CUI::DoScrollbarV(this_00,&RenderImagesList::s_ScrollValue,&Slot,
                           RenderImagesList::s_ScrollValue);
    bVar4 = CUI::MouseInside(this_00,&Slot);
    if ((bVar4) || (bVar4 = CUI::MouseInside(this_00,&ToolBox_local), bVar4)) {
      iVar6 = (int)((fVar14 - ToolBox_local.h) / 14.0);
      if (-1 < iVar6) {
        iVar5 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a4,0);
        fVar16 = (float)(iVar6 + 1);
        if ((char)iVar5 != '\0') {
          fVar12 = RenderImagesList::s_ScrollValue - 1.0 / fVar16;
          fVar13 = 1.0;
          if (fVar12 <= 1.0) {
            fVar13 = fVar12;
          }
          RenderImagesList::s_ScrollValue = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13);
        }
        iVar6 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a5,0);
        if ((char)iVar6 != '\0') {
          fVar13 = 1.0 / fVar16 + RenderImagesList::s_ScrollValue;
          fVar16 = 1.0;
          if (fVar13 <= 1.0) {
            fVar16 = fVar13;
          }
          RenderImagesList::s_ScrollValue = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar16);
        }
      }
    }
  }
  fVar16 = fVar15 * RenderImagesList::s_ScrollValue;
  fVar14 = (RenderImagesList::s_ScrollValue + -1.0) * fVar15 + fVar14;
  uVar11 = 0;
  fVar15 = 0.0;
  while ((uVar11 != 2 && (fVar13 = fVar15 + 15.0, fVar13 <= fVar14))) {
    if (fVar16 <= fVar15) {
      CUIRect::HSplitTop(&ToolBox_local,15.0,&Slot,&ToolBox_local);
      pText = "External";
      if (uVar11 == 0) {
        pText = "Embedded";
      }
      CUI::DoLabel(&this->m_UI,&Slot,pText,12.0,1,-1.0,true);
    }
    for (uVar10 = 0; fVar15 = fVar13, (long)uVar10 < (long)(this->m_Map).m_lImages.num_elements;
        uVar10 = uVar10 + 1) {
      iVar6 = (this->m_Map).m_lImages.list[uVar10]->m_External;
      if (uVar11 == 0) {
        if (iVar6 == 0) goto LAB_0018c520;
      }
      else if (iVar6 != 0) {
LAB_0018c520:
        fVar12 = fVar13 + 14.0;
        if (fVar14 < fVar12) goto LAB_0018c740;
        bVar4 = fVar16 <= fVar13;
        fVar13 = fVar12;
        if (bVar4) {
          CUIRect::HSplitTop(&ToolBox_local,12.0,&Slot,&ToolBox_local);
          bVar4 = false;
          for (lVar7 = 0; (!bVar4 && (lVar7 < (this->m_Map).m_lGroups.num_elements));
              lVar7 = lVar7 + 1) {
            pCVar2 = (this->m_Map).m_lGroups.list[lVar7];
            for (lVar8 = 0; (!bVar4 && (lVar8 < (pCVar2->m_lLayers).num_elements));
                lVar8 = lVar8 + 1) {
              pCVar3 = (pCVar2->m_lLayers).list[lVar8];
              iVar6 = pCVar3->m_Type;
              lVar9 = 0x30;
              if (((iVar6 == 2) || (lVar9 = 0x28, iVar6 == 3)) &&
                 (uVar10 == *(uint *)(pCVar3->m_aName + lVar9 + -0x10))) {
                bVar4 = true;
              }
            }
          }
          pID = (this->m_Map).m_lImages.list + uVar10;
          iVar6 = DoButton_Image(this,pID,(*pID)->m_aName,
                                 (uint)(uVar10 == (uint)this->m_SelectedImage),&Slot,1,
                                 "Select image",bVar4);
          if ((iVar6 != 0) && (this->m_SelectedImage = (int)uVar10, iVar6 == 2)) {
            CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x78,
                             0x50,this,PopupImage,0xf);
          }
          CUIRect::HSplitTop(&ToolBox_local,2.0,(CUIRect *)0x0,&ToolBox_local);
        }
      }
    }
    if (fVar14 < fVar13 + 5.0) break;
    CUIRect::HSplitTop(&ToolBox_local,5.0,&Slot,&ToolBox_local);
    local_68 = Slot.x;
    local_5c = Slot.h * 0.5 + Slot.y;
    local_64 = CONCAT44(Slot.x + Slot.w,local_5c);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (this->m_pGraphics,0xffffffffffffffff);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])(this->m_pGraphics,&local_68,1);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
    uVar11 = uVar11 + 1;
    fVar15 = fVar13 + 5.0;
  }
LAB_0018c740:
  if ((1 < uVar11) && (fVar15 + 17.0 <= fVar14)) {
    CUIRect::HSplitTop(&ToolBox_local,5.0,&Slot,&ToolBox_local);
    CUIRect::HSplitTop(&ToolBox_local,12.0,&Slot,&ToolBox_local);
    iVar6 = DoButton_Editor(this,&RenderImagesList::s_NewImageButton,"Add",0,&Slot,0,
                            "Load a new image to use in the map");
    if (iVar6 != 0) {
      InvokeFileDialog(this,-1,1,"Add Image","Add","mapres","",AddImage,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderImagesList(CUIRect ToolBox)
{
	static float s_ScrollValue = 0.0f;
	const float RowHeight = 14.0f;
	const float HeaderHeight = RowHeight + 1.0f;
	const float HeaderSeparatorHeight = 5.0f;
	const float AddButtonHeight = 17.0f;
	const float ImagesHeight = 2 * (HeaderHeight + HeaderSeparatorHeight) + RowHeight * m_Map.m_lImages.size() + AddButtonHeight;
	const float ScrollDifference = maximum(ImagesHeight - ToolBox.h, 0.0f);

	if(ScrollDifference > 0) // Do we even need a scrollbar?
	{
		CUIRect Scroll;
		ToolBox.VSplitRight(15.0f, &ToolBox, &Scroll);
		ToolBox.VSplitRight(3.0f, &ToolBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);
		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&ToolBox))
		{
			int ScrollNum = (int)((ImagesHeight-ToolBox.h)/RowHeight)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}
	else
		s_ScrollValue = 0.0f;

	const float ImageStartAt = ScrollDifference * s_ScrollValue;
	const float ImageStopAt = ImagesHeight + ScrollDifference * (s_ScrollValue - 1.0f);
	float ImageCur = 0.0f;

	for(int e = 0; e < 2; e++) // two passes, first embedded, then external
	{
		if(ImageCur + HeaderHeight > ImageStopAt)
			return;

		CUIRect Slot;
		if(ImageCur >= ImageStartAt)
		{
			ToolBox.HSplitTop(HeaderHeight, &Slot, &ToolBox);
			UI()->DoLabel(&Slot, e == 0 ? "Embedded" : "External", 12.0f, TEXTALIGN_CENTER);
		}
		ImageCur += HeaderHeight;

		for(int i = 0; i < m_Map.m_lImages.size(); i++)
		{
			if((e && !m_Map.m_lImages[i]->m_External) || (!e && m_Map.m_lImages[i]->m_External))
				continue;

			if(ImageCur + RowHeight > ImageStopAt)
				return;
			else if(ImageCur < ImageStartAt)
			{
				ImageCur += RowHeight;
				continue;
			}
			ImageCur += RowHeight;

			ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);

			// check if images is used
			bool Used = false;
			for(int g = 0; !Used && (g < m_Map.m_lGroups.size()); g++)
			{
				CLayerGroup *pGroup = m_Map.m_lGroups[g];
				for(int l = 0; !Used && l < pGroup->m_lLayers.size(); l++)
				{
					if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
					{
						CLayerTiles *pLayer = static_cast<CLayerTiles *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
					else if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_QUADS)
					{
						CLayerQuads *pLayer = static_cast<CLayerQuads *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
				}
			}

			if(int Result = DoButton_Image(&m_Map.m_lImages[i], m_Map.m_lImages[i]->m_aName, m_SelectedImage == i, &Slot, BUTTON_CONTEXT, "Select image", Used))
			{
				m_SelectedImage = i;

				if(Result == 2)
					UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 80, this, PopupImage);
			}

			ToolBox.HSplitTop(2.0f, 0, &ToolBox);
		}

		// separator
		if(ImageCur + HeaderSeparatorHeight > ImageStopAt)
			return;
		ToolBox.HSplitTop(HeaderSeparatorHeight, &Slot, &ToolBox);
		ImageCur += HeaderSeparatorHeight;
		IGraphics::CLineItem LineItem(Slot.x, Slot.y+Slot.h/2, Slot.x+Slot.w, Slot.y+Slot.h/2);
		Graphics()->TextureClear();
		Graphics()->LinesBegin();
		Graphics()->LinesDraw(&LineItem, 1);
		Graphics()->LinesEnd();
	}

	if(ImageCur + AddButtonHeight > ImageStopAt)
		return;

	// new image
	static int s_NewImageButton = 0;
	CUIRect Slot;
	ToolBox.HSplitTop(5.0f, &Slot, &ToolBox);
	ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);
	if(DoButton_Editor(&s_NewImageButton, "Add", 0, &Slot, 0, "Load a new image to use in the map"))
		InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_IMG, "Add Image", "Add", "mapres", "", AddImage, this);
}